

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O3

void irr::video::CColorConverter::convert16BitTo16Bit
               (s16 *in,s16 *out,s32 width,s32 height,s32 linepad,bool flip)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  s16 *__dest;
  
  if (0 < height && (out != (s16 *)0x0 && in != (s16 *)0x0)) {
    lVar3 = (long)width;
    lVar4 = 0;
    lVar5 = lVar4;
    lVar1 = (long)(height * width);
    lVar2 = -lVar3;
    if (!flip) {
      lVar5 = lVar3;
      lVar1 = lVar4;
      lVar2 = lVar4;
    }
    __dest = out + lVar2 + lVar1;
    do {
      memcpy(__dest,in,lVar3 * 2);
      in = in + lVar3 + linepad;
      __dest = __dest + lVar2 + lVar5;
      height = height + -1;
    } while (height != 0);
  }
  return;
}

Assistant:

void CColorConverter::convert16BitTo16Bit(const s16 *in, s16 *out, s32 width, s32 height, s32 linepad, bool flip)
{
	if (!in || !out)
		return;

	if (flip)
		out += width * height;

	for (s32 y = 0; y < height; ++y) {
		if (flip)
			out -= width;
#ifdef __BIG_ENDIAN__
		for (s32 x = 0; x < width; ++x)
			out[x] = os::Byteswap::byteswap(in[x]);
#else
		memcpy(out, in, width * sizeof(s16));
#endif
		if (!flip)
			out += width;
		in += width;
		in += linepad;
	}
}